

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int GetTelemetersPololu(POLOLU *pPololu,double *pDist1,double *pDist2,double *pDist3,double *pDist4,
                       double *pDist5,double *pDist6,double *pDist7,double *pDist8,double *pDist9,
                       double *pDist10,double *pDist11,double *pDist12)

{
  int iVar1;
  int iVar2;
  int local_108;
  int i;
  int ais [24];
  int selectedchannels [24];
  double *pDist5_local;
  double *pDist4_local;
  double *pDist3_local;
  double *pDist2_local;
  double *pDist1_local;
  POLOLU *pPololu_local;
  
  memset(ais + 0x16,0,0x60);
  memset(&local_108,0,0x60);
  ais[(long)pPololu->telem1analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem2analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem3analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem4analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem5analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem6analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem7analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem8analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem9analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem10analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem11analoginputchan + 0x16] = 1;
  ais[(long)pPololu->telem12analoginputchan + 0x16] = 1;
  iVar2 = GetAllValuesPololu(pPololu,ais + 0x16,&local_108);
  if (iVar2 == 0) {
    iVar1 = pPololu->telem1analoginputchan;
    *pDist1 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem2analoginputchan;
    *pDist2 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem3analoginputchan;
    *pDist3 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem4analoginputchan;
    *pDist4 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem5analoginputchan;
    *pDist5 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem6analoginputchan;
    *pDist6 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem7analoginputchan;
    *pDist7 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem8analoginputchan;
    *pDist8 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem9analoginputchan;
    *pDist9 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
              pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem10analoginputchan;
    *pDist10 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem11analoginputchan;
    *pDist11 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
    iVar1 = pPololu->telem12analoginputchan;
    *pDist12 = (pPololu->analoginputcoef[iVar1] * (double)(&local_108)[iVar1] * 5.0) / 1023.0 +
               pPololu->analoginputoffset[iVar1];
  }
  pPololu_local._4_4_ = (uint)(iVar2 != 0);
  return pPololu_local._4_4_;
}

Assistant:

inline int GetTelemetersPololu(POLOLU* pPololu, double* pDist1, double* pDist2, double* pDist3, double* pDist4, double* pDist5, double* pDist6, double* pDist7, double* pDist8, double* pDist9, double* pDist10, double* pDist11, double* pDist12)
{
	int selectedchannels[NB_CHANNELS_AI_POLOLU];
	int ais[NB_CHANNELS_AI_POLOLU];
	int i = 0;

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(ais, 0, sizeof(ais));

	selectedchannels[pPololu->telem1analoginputchan] = 1;
	selectedchannels[pPololu->telem2analoginputchan] = 1;
	selectedchannels[pPololu->telem3analoginputchan] = 1;
	selectedchannels[pPololu->telem4analoginputchan] = 1;
	selectedchannels[pPololu->telem5analoginputchan] = 1;
	selectedchannels[pPololu->telem6analoginputchan] = 1;
	selectedchannels[pPololu->telem7analoginputchan] = 1;
	selectedchannels[pPololu->telem8analoginputchan] = 1;
	selectedchannels[pPololu->telem9analoginputchan] = 1;
	selectedchannels[pPololu->telem10analoginputchan] = 1;
	selectedchannels[pPololu->telem11analoginputchan] = 1;
	selectedchannels[pPololu->telem12analoginputchan] = 1;

	if (GetAllValuesPololu(pPololu, selectedchannels, ais) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	i = pPololu->telem1analoginputchan;
	*pDist1 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem2analoginputchan;
	*pDist2 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem3analoginputchan;
	*pDist3 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem4analoginputchan;
	*pDist4 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem5analoginputchan;
	*pDist5 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem6analoginputchan;
	*pDist6 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem7analoginputchan;
	*pDist7 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem8analoginputchan;
	*pDist8 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem9analoginputchan;
	*pDist9 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem10analoginputchan;
	*pDist10 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem11analoginputchan;
	*pDist11 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];
	i = pPololu->telem12analoginputchan;
	*pDist12 = pPololu->analoginputcoef[i]*ais[i]*5.0/1023.0+pPololu->analoginputoffset[i];

	return EXIT_SUCCESS;
}